

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Element::Element(Element *this,Token *key_token,Parser *parser)

{
  TokenList *this_00;
  pointer *pppTVar1;
  pointer ppTVar2;
  iterator iVar3;
  Scope *this_01;
  Token *pTVar4;
  undefined8 extraout_RAX;
  TokenType TVar5;
  TokenPtr n;
  Token *local_50;
  string local_48;
  
  this->key_token = key_token;
  this_00 = &this->tokens;
  (this->tokens).
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokens).
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokens).
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compound)._M_t.
  super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
  super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl = (Scope *)0x0;
  do {
    parser->last = parser->current;
    ppTVar2 = (parser->cursor)._M_current;
    if (ppTVar2 ==
        (parser->tokens->
        super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>)
        ._M_impl.super__Vector_impl_data._M_finish) {
      parser->current = (TokenPtr)0x0;
      local_50 = (Token *)0x0;
LAB_005cf7d9:
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"unexpected end of file, expected closing bracket","");
      anon_unknown.dwarf_132c4df::ParseError(&local_48,parser->last);
      pTVar4 = local_50;
LAB_005cf809:
      local_50 = pTVar4;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"unexpected token; expected bracket, comma or key","");
      anon_unknown.dwarf_132c4df::ParseError(&local_48,local_50);
LAB_005cf839:
      parser->current = (TokenPtr)0x0;
      local_50 = (Token *)0x0;
      pTVar4 = local_50;
LAB_005cf845:
      local_50 = pTVar4;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"unexpected end of file, expected bracket, comma or key","");
      anon_unknown.dwarf_132c4df::ParseError(&local_48,parser->last);
LAB_005cf875:
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"expected closing bracket","");
      anon_unknown.dwarf_132c4df::ParseError(&local_48,local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      std::unique_ptr<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>::~unique_ptr
                (&this->compound);
      ppTVar2 = (this_00->
                super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (ppTVar2 != (pointer)0x0) {
        operator_delete(ppTVar2,(long)(this->tokens).
                                      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppTVar2);
      }
      _Unwind_Resume(extraout_RAX);
    }
    (parser->cursor)._M_current = ppTVar2 + 1;
    local_50 = *ppTVar2;
    parser->current = local_50;
    if (local_50 == (Token *)0x0) goto LAB_005cf7d9;
    TVar5 = local_50->type;
    if (TVar5 == TokenType_DATA) {
      iVar3._M_current =
           (this->tokens).
           super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->tokens).
          super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
        _M_realloc_insert<Assimp::FBX::Token_const*const&>
                  ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
                   this_00,iVar3,&local_50);
      }
      else {
        *iVar3._M_current = local_50;
        pppTVar1 = &(this->tokens).
                    super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      parser->last = parser->current;
      ppTVar2 = (parser->cursor)._M_current;
      if (ppTVar2 ==
          (parser->tokens->
          super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) goto LAB_005cf839;
      (parser->cursor)._M_current = ppTVar2 + 1;
      pTVar4 = *ppTVar2;
      parser->current = pTVar4;
      if (pTVar4 != (Token *)0x0) {
        TVar5 = pTVar4->type;
        if (TVar5 == TokenType_DATA) {
          if ((local_50->type == TokenType_DATA) &&
             (*(int *)&local_50->field_3 + 1 == *(int *)&pTVar4->field_3)) {
            iVar3._M_current =
                 (this->tokens).
                 super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->tokens).
                super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_50 = pTVar4;
              std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
              _M_realloc_insert<Assimp::FBX::Token_const*const&>
                        ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>
                          *)this_00,iVar3,&local_50);
            }
            else {
              *iVar3._M_current = pTVar4;
              pppTVar1 = &(this->tokens).
                          super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
              local_50 = pTVar4;
            }
            goto LAB_005cf73a;
          }
        }
        else {
          local_50 = pTVar4;
          if ((TVar5 & ~TokenType_KEY) == TokenType_OPEN_BRACKET) goto LAB_005cf736;
        }
        goto LAB_005cf809;
      }
      goto LAB_005cf845;
    }
LAB_005cf736:
    if (TVar5 == TokenType_OPEN_BRACKET) {
      this_01 = (Scope *)operator_new(0x30);
      Scope::Scope(this_01,parser,false);
      std::__uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>::reset
                ((__uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_> *)
                 &this->compound,this_01);
      local_50 = parser->current;
      if (local_50->type == TokenType_CLOSE_BRACKET) {
        parser->last = local_50;
        ppTVar2 = (parser->cursor)._M_current;
        if (ppTVar2 ==
            (parser->tokens->
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          pTVar4 = (Token *)0x0;
        }
        else {
          (parser->cursor)._M_current = ppTVar2 + 1;
          pTVar4 = *ppTVar2;
        }
        parser->current = pTVar4;
        return;
      }
      goto LAB_005cf875;
    }
LAB_005cf73a:
    if ((local_50->type | TokenType_COMMA) == TokenType_KEY) {
      return;
    }
  } while( true );
}

Assistant:

Element::Element(const Token& key_token, Parser& parser)
: key_token(key_token)
{
    TokenPtr n = nullptr;
    do {
        n = parser.AdvanceToNextToken();
        if(!n) {
            ParseError("unexpected end of file, expected closing bracket",parser.LastToken());
        }

        if (n->Type() == TokenType_DATA) {
            tokens.push_back(n);
			TokenPtr prev = n;
            n = parser.AdvanceToNextToken();
            if(!n) {
                ParseError("unexpected end of file, expected bracket, comma or key",parser.LastToken());
            }

			const TokenType ty = n->Type();

			// some exporters are missing a comma on the next line
			if (ty == TokenType_DATA && prev->Type() == TokenType_DATA && (n->Line() == prev->Line() + 1)) {
				tokens.push_back(n);
				continue;
			}

            if (ty != TokenType_OPEN_BRACKET && ty != TokenType_CLOSE_BRACKET && ty != TokenType_COMMA && ty != TokenType_KEY) {
                ParseError("unexpected token; expected bracket, comma or key",n);
            }
        }

        if (n->Type() == TokenType_OPEN_BRACKET) {
            compound.reset(new Scope(parser));

            // current token should be a TOK_CLOSE_BRACKET
            n = parser.CurrentToken();
            ai_assert(n);

            if (n->Type() != TokenType_CLOSE_BRACKET) {
                ParseError("expected closing bracket",n);
            }

            parser.AdvanceToNextToken();
            return;
        }
    }
    while(n->Type() != TokenType_KEY && n->Type() != TokenType_CLOSE_BRACKET);
}